

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns_core.c
# Opt level: O0

void WebRtcNs_ProcessCore
               (NoiseSuppressionC *self,float **speechFrame,size_t num_bands,float **outFrame)

{
  float *pfVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  float local_1380;
  float local_137c;
  float local_1378;
  float local_1374;
  float local_1370;
  float local_136c;
  float local_1368;
  float local_1364;
  ulong local_1360;
  size_t num_high_bands;
  float **outFrameHB;
  float **speechFrameHB;
  float local_1340;
  float sumMagnProcess;
  float sumMagnAnalyze;
  float gainModHB;
  float avgFilterGainHB;
  float avgProbSpeechHBTmp;
  float avgProbSpeechHB;
  float gainTimeDomainHB;
  float gainMapParHB;
  float decayBweHB;
  int deltaGainHB;
  int deltaBweHB;
  float imag [129];
  float local_1108 [2];
  float real [256];
  float theFilterTmp [129];
  float local_af8 [2];
  float theFilter [129];
  float local_8e8 [2];
  float magn [129];
  float local_6d8 [2];
  float winData [256];
  float fout [160];
  float factor2;
  float factor1;
  float factor;
  float gain;
  float energy2;
  float energy1;
  size_t j;
  size_t i;
  int flagHB;
  float **outFrame_local;
  size_t num_bands_local;
  float **speechFrame_local;
  NoiseSuppressionC *self_local;
  
  decayBweHB = 1.4013e-45;
  if (self->initFlag != 1) {
    __assert_fail("self->initFlag == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/ns/ns_core.c"
                  ,0x4b9,
                  "void WebRtcNs_ProcessCore(NoiseSuppressionC *, const float *const *, size_t, float *const *)"
                 );
  }
  if (2 < num_bands - 1) {
    __assert_fail("(num_bands - 1) <= NUM_HIGH_BANDS_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/ns/ns_core.c"
                  ,0x4ba,
                  "void WebRtcNs_ProcessCore(NoiseSuppressionC *, const float *const *, size_t, float *const *)"
                 );
  }
  outFrameHB = (float **)0x0;
  num_high_bands = 0;
  local_1360 = 0;
  bVar2 = 1 < num_bands;
  if (bVar2) {
    outFrameHB = speechFrame + 1;
    num_high_bands = (size_t)(outFrame + 1);
    local_1360 = num_bands - 1;
    decayBweHB = (float)((long)((ulong)(uint)((int)self->magnLen >> 0x1f) << 0x20 |
                               self->magnLen & 0xffffffff) / 4);
  }
  UpdateBuffer(*speechFrame,self->blockLen,self->anaLen,self->dataBuf);
  if (bVar2) {
    for (j = 0; j < local_1360; j = j + 1) {
      UpdateBuffer(outFrameHB[j],self->blockLen,self->anaLen,self->dataBufHB[j]);
    }
  }
  Windowing(self->window,self->dataBuf,self->anaLen,local_6d8);
  fVar3 = Energy(local_6d8,self->anaLen);
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    FFT(self,local_6d8,self->anaLen,self->magnLen,local_1108,(float *)&deltaGainHB,local_8e8);
    if (self->blockInd < 0x32) {
      for (j = 0; j < self->magnLen; j = j + 1) {
        self->initMagnEst[j] = local_8e8[j] + self->initMagnEst[j];
      }
    }
    ComputeDdBasedWienerFilter(self,local_8e8,local_af8);
    for (j = 0; j < self->magnLen; j = j + 1) {
      if (local_af8[j] < self->denoiseBound) {
        local_af8[j] = self->denoiseBound;
      }
      if (1.0 < local_af8[j]) {
        local_af8[j] = 1.0;
      }
      if (self->blockInd < 0x32) {
        real[j + 0xfe] = -self->overdrive * self->parametricNoise[j] + self->initMagnEst[j];
        real[j + 0xfe] = real[j + 0xfe] / (self->initMagnEst[j] + 0.0001);
        if (real[j + 0xfe] < self->denoiseBound) {
          real[j + 0xfe] = self->denoiseBound;
        }
        if (1.0 < real[j + 0xfe]) {
          real[j + 0xfe] = 1.0;
        }
        local_af8[j] = (float)self->blockInd * local_af8[j];
        real[j + 0xfe] = (float)(0x32 - self->blockInd) * real[j + 0xfe];
        local_af8[j] = real[j + 0xfe] + local_af8[j];
        local_af8[j] = local_af8[j] / 50.0;
      }
      self->smooth[j] = local_af8[j];
      local_1108[j] = self->smooth[j] * local_1108[j];
      (&deltaGainHB)[j] = (int)(self->smooth[j] * (float)(&deltaGainHB)[j]);
    }
    memcpy(self->magnPrevProcess,local_8e8,self->magnLen << 2);
    memcpy(self->noisePrev,self->noise,self->magnLen << 2);
    IFFT(self,local_1108,(float *)&deltaGainHB,self->magnLen,self->anaLen,local_6d8);
    factor2 = 1.0;
    if ((self->gainmap == 1) && (200 < self->blockInd)) {
      fout[0x9f] = 1.0;
      fout[0x9e] = 1.0;
      fVar4 = Energy(local_6d8,self->anaLen);
      dVar5 = sqrt((double)(fVar4 / (fVar3 + 1.0)));
      factor1 = (float)dVar5;
      if ((0.5 < factor1) && (fout[0x9f] = (factor1 - 0.5) * 1.3 + 1.0, 1.0 < factor1 * fout[0x9f]))
      {
        fout[0x9f] = 1.0 / factor1;
      }
      if (factor1 < 0.5) {
        if (factor1 <= self->denoiseBound) {
          factor1 = self->denoiseBound;
        }
        fout[0x9e] = (0.5 - factor1) * -0.3 + 1.0;
      }
      factor2 = self->priorSpeechProb * fout[0x9f] + (1.0 - self->priorSpeechProb) * fout[0x9e];
    }
    Windowing(self->window,local_6d8,self->anaLen,local_6d8);
    for (j = 0; j < self->anaLen; j = j + 1) {
      self->syntBuf[j] = factor2 * local_6d8[j] + self->syntBuf[j];
    }
    for (j = self->windShift; j < self->blockLen + self->windShift; j = j + 1) {
      winData[(j - self->windShift) + 0xfe] = self->syntBuf[j];
    }
    UpdateBuffer((float *)0x0,self->blockLen,self->anaLen,self->syntBuf);
    for (j = 0; j < self->blockLen; j = j + 1) {
      if (winData[j + 0xfe] <= 32767.0) {
        if (-32768.0 < winData[j + 0xfe] || winData[j + 0xfe] == -32768.0) {
          local_1378 = winData[j + 0xfe];
        }
        else {
          local_1378 = -32768.0;
        }
        local_1374 = local_1378;
      }
      else {
        local_1374 = 32767.0;
      }
      (*outFrame)[j] = local_1374;
    }
    if (bVar2) {
      avgFilterGainHB = 0.0;
      for (j = (self->magnLen - (long)(int)decayBweHB) - 1; j < self->magnLen - 1; j = j + 1) {
        avgFilterGainHB = self->speechProb[j] + avgFilterGainHB;
      }
      local_1340 = 0.0;
      speechFrameHB._4_4_ = 0.0;
      for (j = 0; j < self->magnLen; j = j + 1) {
        local_1340 = self->magnPrevAnalyze[j] + local_1340;
        speechFrameHB._4_4_ = self->magnPrevProcess[j] + speechFrameHB._4_4_;
      }
      fVar3 = (speechFrameHB._4_4_ / local_1340) * (avgFilterGainHB / (float)(int)decayBweHB);
      sumMagnAnalyze = 0.0;
      for (j = (self->magnLen - (long)(int)decayBweHB) - 1; j < self->magnLen - 1; j = j + 1) {
        sumMagnAnalyze = self->smooth[j] + sumMagnAnalyze;
      }
      dVar5 = tanh((double)((fVar3 + fVar3 + -1.0) * 1.0));
      fVar4 = ((float)dVar5 + 1.0) * 0.5;
      avgProbSpeechHBTmp = fVar4 * 0.5 + (sumMagnAnalyze / (float)(int)decayBweHB) * 0.5;
      if (0.5 <= fVar3) {
        avgProbSpeechHBTmp = fVar4 * 0.25 + (sumMagnAnalyze / (float)(int)decayBweHB) * 0.75;
      }
      avgProbSpeechHBTmp = avgProbSpeechHBTmp * 1.0;
      if (avgProbSpeechHBTmp < self->denoiseBound) {
        avgProbSpeechHBTmp = self->denoiseBound;
      }
      if (1.0 < avgProbSpeechHBTmp) {
        avgProbSpeechHBTmp = 1.0;
      }
      for (j = 0; j < local_1360; j = j + 1) {
        for (_energy2 = 0; _energy2 < self->blockLen; _energy2 = _energy2 + 1) {
          if (avgProbSpeechHBTmp * self->dataBufHB[j][_energy2] <= 32767.0) {
            if (-32768.0 <= avgProbSpeechHBTmp * self->dataBufHB[j][_energy2]) {
              local_1380 = avgProbSpeechHBTmp * self->dataBufHB[j][_energy2];
            }
            else {
              local_1380 = -32768.0;
            }
            local_137c = local_1380;
          }
          else {
            local_137c = 32767.0;
          }
          *(float *)(*(long *)(num_high_bands + j * 8) + _energy2 * 4) = local_137c;
        }
      }
    }
  }
  else {
    for (j = self->windShift; j < self->blockLen + self->windShift; j = j + 1) {
      winData[(j - self->windShift) + 0xfe] = self->syntBuf[j];
    }
    UpdateBuffer((float *)0x0,self->blockLen,self->anaLen,self->syntBuf);
    for (j = 0; j < self->blockLen; j = j + 1) {
      if (winData[j + 0xfe] <= 32767.0) {
        if (-32768.0 < winData[j + 0xfe] || winData[j + 0xfe] == -32768.0) {
          local_1368 = winData[j + 0xfe];
        }
        else {
          local_1368 = -32768.0;
        }
        local_1364 = local_1368;
      }
      else {
        local_1364 = 32767.0;
      }
      (*outFrame)[j] = local_1364;
    }
    if (bVar2) {
      for (j = 0; j < local_1360; j = j + 1) {
        for (_energy2 = 0; _energy2 < self->blockLen; _energy2 = _energy2 + 1) {
          if (self->dataBufHB[j][_energy2] <= 32767.0) {
            pfVar1 = self->dataBufHB[j] + _energy2;
            if (-32768.0 < *pfVar1 || *pfVar1 == -32768.0) {
              local_1370 = self->dataBufHB[j][_energy2];
            }
            else {
              local_1370 = -32768.0;
            }
            local_136c = local_1370;
          }
          else {
            local_136c = 32767.0;
          }
          *(float *)(*(long *)(num_high_bands + j * 8) + _energy2 * 4) = local_136c;
        }
      }
    }
  }
  return;
}

Assistant:

void WebRtcNs_ProcessCore(NoiseSuppressionC* self,
                          const float* const* speechFrame,
                          size_t num_bands,
                          float* const* outFrame) {
  // Main routine for noise reduction.
  int flagHB = 0;
  size_t i, j;

  float energy1, energy2, gain, factor, factor1, factor2;
  float fout[BLOCKL_MAX];
  float winData[ANAL_BLOCKL_MAX];
  float magn[HALF_ANAL_BLOCKL];
  float theFilter[HALF_ANAL_BLOCKL], theFilterTmp[HALF_ANAL_BLOCKL];
  float real[ANAL_BLOCKL_MAX], imag[HALF_ANAL_BLOCKL];

  // SWB variables.
  int deltaBweHB = 1;
  int deltaGainHB = 1;
  float decayBweHB = 1.0;
  float gainMapParHB = 1.0;
  float gainTimeDomainHB = 1.0;
  float avgProbSpeechHB, avgProbSpeechHBTmp, avgFilterGainHB, gainModHB;
  float sumMagnAnalyze, sumMagnProcess;

  // Check that initiation has been done.
  assert(self->initFlag == 1);
  assert((num_bands - 1) <= NUM_HIGH_BANDS_MAX);

  const float* const* speechFrameHB = NULL;
  float* const* outFrameHB = NULL;
  size_t num_high_bands = 0;
  if (num_bands > 1) {
    speechFrameHB = &speechFrame[1];
    outFrameHB = &outFrame[1];
    num_high_bands = num_bands - 1;
    flagHB = 1;
    // Range for averaging low band quantities for H band gain.
    deltaBweHB = (int)self->magnLen / 4;
    deltaGainHB = deltaBweHB;
  }

  // Update analysis buffer for L band.
  UpdateBuffer(speechFrame[0], self->blockLen, self->anaLen, self->dataBuf);

  if (flagHB == 1) {
    // Update analysis buffer for H bands.
    for (i = 0; i < num_high_bands; ++i) {
      UpdateBuffer(speechFrameHB[i],
                   self->blockLen,
                   self->anaLen,
                   self->dataBufHB[i]);
    }
  }

  Windowing(self->window, self->dataBuf, self->anaLen, winData);
  energy1 = Energy(winData, self->anaLen);
  if (energy1 == 0.0) {
    // Synthesize the special case of zero input.
    // Read out fully processed segment.
    for (i = self->windShift; i < self->blockLen + self->windShift; i++) {
      fout[i - self->windShift] = self->syntBuf[i];
    }
    // Update synthesis buffer.
    UpdateBuffer(NULL, self->blockLen, self->anaLen, self->syntBuf);

    for (i = 0; i < self->blockLen; ++i)
      outFrame[0][i] =
          WEBRTC_SPL_SAT(WEBRTC_SPL_WORD16_MAX, fout[i], WEBRTC_SPL_WORD16_MIN);

    // For time-domain gain of HB.
    if (flagHB == 1) {
      for (i = 0; i < num_high_bands; ++i) {
        for (j = 0; j < self->blockLen; ++j) {
          outFrameHB[i][j] = WEBRTC_SPL_SAT(WEBRTC_SPL_WORD16_MAX,
                                            self->dataBufHB[i][j],
                                            WEBRTC_SPL_WORD16_MIN);
        }
      }
    }

    return;
  }

  FFT(self, winData, self->anaLen, self->magnLen, real, imag, magn);

  if (self->blockInd < END_STARTUP_SHORT) {
    for (i = 0; i < self->magnLen; i++) {
      self->initMagnEst[i] += magn[i];
    }
  }

  ComputeDdBasedWienerFilter(self, magn, theFilter);

  for (i = 0; i < self->magnLen; i++) {
    // Flooring bottom.
    if (theFilter[i] < self->denoiseBound) {
      theFilter[i] = self->denoiseBound;
    }
    // Flooring top.
    if (theFilter[i] > 1.f) {
      theFilter[i] = 1.f;
    }
    if (self->blockInd < END_STARTUP_SHORT) {
      theFilterTmp[i] =
          (self->initMagnEst[i] - self->overdrive * self->parametricNoise[i]);
      theFilterTmp[i] /= (self->initMagnEst[i] + 0.0001f);
      // Flooring bottom.
      if (theFilterTmp[i] < self->denoiseBound) {
        theFilterTmp[i] = self->denoiseBound;
      }
      // Flooring top.
      if (theFilterTmp[i] > 1.f) {
        theFilterTmp[i] = 1.f;
      }
      // Weight the two suppression filters.
      theFilter[i] *= (self->blockInd);
      theFilterTmp[i] *= (END_STARTUP_SHORT - self->blockInd);
      theFilter[i] += theFilterTmp[i];
      theFilter[i] /= (END_STARTUP_SHORT);
    }

    self->smooth[i] = theFilter[i];
    real[i] *= self->smooth[i];
    imag[i] *= self->smooth[i];
  }
  // Keep track of |magn| spectrum for next frame.
  memcpy(self->magnPrevProcess, magn, sizeof(*magn) * self->magnLen);
  memcpy(self->noisePrev, self->noise, sizeof(self->noise[0]) * self->magnLen);
  // Back to time domain.
  IFFT(self, real, imag, self->magnLen, self->anaLen, winData);

  // Scale factor: only do it after END_STARTUP_LONG time.
  factor = 1.f;
  if (self->gainmap == 1 && self->blockInd > END_STARTUP_LONG) {
    factor1 = 1.f;
    factor2 = 1.f;

    energy2 = Energy(winData, self->anaLen);
    gain = (float)sqrt(energy2 / (energy1 + 1.f));

    // Scaling for new version.
    if (gain > B_LIM) {
      factor1 = 1.f + 1.3f * (gain - B_LIM);
      if (gain * factor1 > 1.f) {
        factor1 = 1.f / gain;
      }
    }
    if (gain < B_LIM) {
      // Don't reduce scale too much for pause regions:
      // attenuation here should be controlled by flooring.
      if (gain <= self->denoiseBound) {
        gain = self->denoiseBound;
      }
      factor2 = 1.f - 0.3f * (B_LIM - gain);
    }
    // Combine both scales with speech/noise prob:
    // note prior (priorSpeechProb) is not frequency dependent.
    factor = self->priorSpeechProb * factor1 +
             (1.f - self->priorSpeechProb) * factor2;
  }  // Out of self->gainmap == 1.

  Windowing(self->window, winData, self->anaLen, winData);

  // Synthesis.
  for (i = 0; i < self->anaLen; i++) {
    self->syntBuf[i] += factor * winData[i];
  }
  // Read out fully processed segment.
  for (i = self->windShift; i < self->blockLen + self->windShift; i++) {
    fout[i - self->windShift] = self->syntBuf[i];
  }
  // Update synthesis buffer.
  UpdateBuffer(NULL, self->blockLen, self->anaLen, self->syntBuf);

  for (i = 0; i < self->blockLen; ++i)
    outFrame[0][i] =
        WEBRTC_SPL_SAT(WEBRTC_SPL_WORD16_MAX, fout[i], WEBRTC_SPL_WORD16_MIN);

  // For time-domain gain of HB.
  if (flagHB == 1) {
    // Average speech prob from low band.
    // Average over second half (i.e., 4->8kHz) of frequencies spectrum.
    avgProbSpeechHB = 0.0;
    for (i = self->magnLen - deltaBweHB - 1; i < self->magnLen - 1; i++) {
      avgProbSpeechHB += self->speechProb[i];
    }
    avgProbSpeechHB = avgProbSpeechHB / ((float)deltaBweHB);
    // If the speech was suppressed by a component between Analyze and
    // Process, for example the AEC, then it should not be considered speech
    // for high band suppression purposes.
    sumMagnAnalyze = 0;
    sumMagnProcess = 0;
    for (i = 0; i < self->magnLen; ++i) {
      sumMagnAnalyze += self->magnPrevAnalyze[i];
      sumMagnProcess += self->magnPrevProcess[i];
    }
    avgProbSpeechHB *= sumMagnProcess / sumMagnAnalyze;
    // Average filter gain from low band.
    // Average over second half (i.e., 4->8kHz) of frequencies spectrum.
    avgFilterGainHB = 0.0;
    for (i = self->magnLen - deltaGainHB - 1; i < self->magnLen - 1; i++) {
      avgFilterGainHB += self->smooth[i];
    }
    avgFilterGainHB = avgFilterGainHB / ((float)(deltaGainHB));
    avgProbSpeechHBTmp = 2.f * avgProbSpeechHB - 1.f;
    // Gain based on speech probability.
    gainModHB = 0.5f * (1.f + (float)tanh(gainMapParHB * avgProbSpeechHBTmp));
    // Combine gain with low band gain.
    gainTimeDomainHB = 0.5f * gainModHB + 0.5f * avgFilterGainHB;
    if (avgProbSpeechHB >= 0.5f) {
      gainTimeDomainHB = 0.25f * gainModHB + 0.75f * avgFilterGainHB;
    }
    gainTimeDomainHB = gainTimeDomainHB * decayBweHB;
    // Make sure gain is within flooring range.
    // Flooring bottom.
    if (gainTimeDomainHB < self->denoiseBound) {
      gainTimeDomainHB = self->denoiseBound;
    }
    // Flooring top.
    if (gainTimeDomainHB > 1.f) {
      gainTimeDomainHB = 1.f;
    }
    // Apply gain.
    for (i = 0; i < num_high_bands; ++i) {
      for (j = 0; j < self->blockLen; j++) {
        outFrameHB[i][j] =
            WEBRTC_SPL_SAT(WEBRTC_SPL_WORD16_MAX,
                           gainTimeDomainHB * self->dataBufHB[i][j],
                           WEBRTC_SPL_WORD16_MIN);
      }
    }
  }  // End of H band gain computation.
}